

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::LDFARoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,Label *rejectlabel,LookaheadDFA<unsigned_char> *ldfa,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  pointer pLVar1;
  long lVar2;
  pointer pLVar3;
  long lVar4;
  int i;
  int iVar5;
  long lVar6;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label local_40;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
             (Operand_ *)(asmjit::x86OpData + 0x4e0));
  iVar5 = 0;
  while( true ) {
    pLVar1 = (ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar3 = (ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)pLVar1 - (long)pLVar3) / 0x50) <= iVar5) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
              (&local_40,as,((long)pLVar1 - (long)pLVar3) % 0x50);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::emplace_back<asmjit::Label>
              (&statelabels,&local_40);
    iVar5 = iVar5 + 1;
  }
  lVar2 = 0;
  lVar4 = 0;
  lVar6 = 0;
  while( true ) {
    if ((int)(((long)pLVar1 - (long)pLVar3) / 0x50) <= lVar6) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
              (as,(long)&((statelabels.
                           super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
                           .super__Vector_impl_data._M_start)->super_Operand).super_Operand_.field_0
                  + lVar2,((long)pLVar1 - (long)pLVar3) % 0x50);
    emit_state(as,rejectlabel,
               (LDFAState<unsigned_char> *)
               ((long)&(((ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                         super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                       )._vptr_NFABaseState + lVar4),&statelabels,exitlabels);
    pLVar3 = (ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (ldfa->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x50;
    lVar2 = lVar2 + 0x10;
  }
  std::_Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>::~_Vector_base
            (&statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LookaheadDFA<TCHAR>& ldfa, std::vector<asmjit::Label>& exitlabels)
{
    std::vector<asmjit::Label> statelabels;

    as.mov(PEEK_REG, INPUT_REG);

    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }
    for (int i = 0; i < ldfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);
        emit_state(as, rejectlabel, ldfa[i], statelabels, exitlabels);
    }
}